

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O0

Object * resolveLogical(Object *__return_storage_ptr__,Logical expr,Environment *env)

{
  Literal l;
  undefined8 uVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  Literal LVar5;
  Literal LVar6;
  double local_108;
  double local_100;
  bool local_ce;
  bool local_cd;
  double b;
  double a;
  Literal ret;
  Literal ret_2;
  Literal ret_1;
  Literal right;
  Literal left;
  Object r;
  Environment *env_local;
  
  uVar1 = expr._0_8_;
  compareInstance((Object *)&left.field_2,expr,env);
  if (left.field_2.lVal == 0) {
    LVar5 = resolveLiteral(expr.left,expr.line,env);
    LVar6 = resolveLiteral(expr.right,expr.line,env);
    right.field_2.iVal._4_4_ = LVar5.type;
    ret_1.field_2.iVal._4_4_ = LVar6.type;
    if ((right.field_2.iVal._4_4_ == 4) || (ret_1.field_2.iVal._4_4_ == 4)) {
      ret_1.line = 0;
      if (expr.op.type == TOKEN_BANG_EQUAL) {
        local_ce = right.field_2.iVal._4_4_ != 4 || ret_1.field_2.iVal._4_4_ != 4;
        ret_1.line = (int)local_ce;
      }
      else if (expr.op.type == TOKEN_EQUAL_EQUAL) {
        local_cd = right.field_2.iVal._4_4_ == 4 && ret_1.field_2.iVal._4_4_ == 4;
        ret_1.line = (int)local_cd;
      }
      else {
        printf("\x1b[31m\n[Runtime Error] [Line:%d] Unable to compare Null!\x1b[0m",
               uVar1 & 0xffffffff);
      }
      LVar5.type = 3;
      LVar5.line = expr.line;
      LVar5.field_2.lVal = ret_1.line;
      LVar5.field_2.iVal._4_4_ = ret_1.type;
      fromLiteral(__return_storage_ptr__,LVar5);
    }
    else {
      right.field_2.lVal = LVar5.line;
      left._0_8_ = LVar5.field_2;
      right._0_8_ = LVar6.field_2;
      if ((right.field_2.iVal._4_4_ == 2) && (ret_1.field_2.iVal._4_4_ == 2)) {
        ret_2.line = 0;
        switch(expr.op.type) {
        case TOKEN_BANG_EQUAL:
          iVar2 = strcmp((char *)left._0_8_,(char *)right._0_8_);
          ret_2.line = (int)(iVar2 != 0);
          break;
        default:
          printf("\x1b[31m\n[Runtime Error] [Line:%d] Bad logical operator between string operands!\x1b[0m"
                 ,uVar1 & 0xffffffff);
          stop();
          break;
        case TOKEN_EQUAL_EQUAL:
          iVar2 = strcmp((char *)left._0_8_,(char *)right._0_8_);
          ret_2.line = (int)(iVar2 == 0);
          break;
        case TOKEN_GREATER:
          sVar3 = strlen((char *)left._0_8_);
          sVar4 = strlen((char *)right._0_8_);
          ret_2.line = (int)(sVar4 < sVar3);
          break;
        case TOKEN_GREATER_EQUAL:
          sVar3 = strlen((char *)left._0_8_);
          sVar4 = strlen((char *)right._0_8_);
          ret_2.line = (int)(sVar4 <= sVar3);
          break;
        case TOKEN_LESS:
          sVar3 = strlen((char *)left._0_8_);
          sVar4 = strlen((char *)right._0_8_);
          ret_2.line = (int)(sVar3 < sVar4);
          break;
        case TOKEN_LESS_EQUAL:
          sVar3 = strlen((char *)left._0_8_);
          sVar4 = strlen((char *)right._0_8_);
          ret_2.line = (int)(sVar3 <= sVar4);
        }
        l.type = 3;
        l.line = right.field_2.lVal;
        l.field_2.lVal = ret_2.line;
        l.field_2.iVal._4_4_ = ret_2.type;
        fromLiteral(__return_storage_ptr__,l);
      }
      else {
        iVar2 = isNumeric(LVar5);
        if (((iVar2 == 0) && (right.field_2.iVal._4_4_ != 3)) ||
           ((iVar2 = isNumeric(LVar6), iVar2 == 0 && (ret_1.field_2.iVal._4_4_ != 3)))) {
          printf("\x1b[31m\n[Runtime Error] [Line:%d] Bad operand for logical operator!\x1b[0m",
                 uVar1 & 0xffffffff);
          stop();
          memcpy(__return_storage_ptr__,&nullObject,0x40);
        }
        else {
          if (right.field_2.iVal._4_4_ == 1) {
            local_100 = (double)(long)left._0_8_;
          }
          else {
            local_100 = (double)left._0_8_;
          }
          if (ret_1.field_2.iVal._4_4_ == 1) {
            local_108 = (double)(long)right._0_8_;
          }
          else {
            local_108 = (double)right._0_8_;
          }
          right.line = LVar6.field_2._0_4_;
          left.line = LVar5.field_2._0_4_;
          switch(expr.op.type) {
          case TOKEN_BANG_EQUAL:
            ret.line = (int)(1e-25 < ABS(local_100 - local_108));
            break;
          default:
            break;
          case TOKEN_EQUAL_EQUAL:
            ret.line = (int)(ABS(local_100 - local_108) <= 1e-25);
            break;
          case TOKEN_GREATER:
            ret.line = (int)(local_108 < local_100);
            break;
          case TOKEN_GREATER_EQUAL:
            ret.line = (int)(local_108 <= local_100);
            break;
          case TOKEN_LESS:
            ret.line = (int)(local_100 < local_108);
            break;
          case TOKEN_LESS_EQUAL:
            ret.line = (int)(local_100 <= local_108);
            break;
          case TOKEN_AND:
            if ((right.field_2.iVal._4_4_ != 3) || (ret_1.field_2.iVal._4_4_ != 3)) {
              printf("\x1b[31m\n[Runtime Error] [Line:%d] \'And\' can only be applied over logical expressions!\x1b[0m"
                     ,uVar1 & 0xffffffff);
              stop();
            }
            ret.line = left.line & right.line;
            break;
          case TOKEN_OR:
            if ((right.field_2.iVal._4_4_ != 3) || (ret_1.field_2.iVal._4_4_ != 3)) {
              printf("\x1b[31m\n[Runtime Error] [Line:%d] \'Or\' can only be applied over logical expressions!\x1b[0m"
                     ,uVar1 & 0xffffffff);
              stop();
            }
            ret.line = left.line | right.line;
          }
          LVar6.type = 3;
          LVar6.line = right.field_2.lVal;
          LVar6.field_2.lVal = ret.line;
          LVar6.field_2.iVal._4_4_ = ret.type;
          fromLiteral(__return_storage_ptr__,LVar6);
        }
      }
    }
  }
  else {
    memcpy(__return_storage_ptr__,&left.field_2,0x40);
  }
  return __return_storage_ptr__;
}

Assistant:

static Object resolveLogical(Logical expr, Environment *env){
    Object r = compareInstance(expr, env);
    if(r.type != OBJECT_NULL)
        return r;
    Literal left = resolveLiteral(expr.left, expr.line, env);
    Literal right = resolveLiteral(expr.right, expr.line, env);
    //    printf("\n[Logical] Got %s and %s for operator %s", literalNames[left.type], literalNames[right.type], tokenNames[expr.op.type]);
    if(left.type == LIT_NULL || right.type == LIT_NULL){
        Literal ret = {expr.line, LIT_LOGICAL, {0}};
        switch(expr.op.type){
            case TOKEN_EQUAL_EQUAL:
                ret.lVal = left.type == LIT_NULL && right.type == LIT_NULL;
                break;
            case TOKEN_BANG_EQUAL:
                ret.lVal = left.type != LIT_NULL || right.type != LIT_NULL;
                break;
            default:
                printf(runtime_error("Unable to compare Null!"), expr.line);
                break;
        }
        return fromLiteral(ret);
    }
    if(left.type == LIT_STRING && right.type == LIT_STRING){
        Literal ret = {expr.line, LIT_LOGICAL, {0}};
        ret.line = left.line;
        switch(expr.op.type){
            case TOKEN_GREATER:
                ret.lVal = strlen(left.sVal) > strlen(right.sVal);
                break;
            case TOKEN_GREATER_EQUAL:
                ret.lVal = strlen(left.sVal) >= strlen(right.sVal);
                break;
            case TOKEN_LESS:
                ret.lVal = strlen(left.sVal) < strlen(right.sVal);
                break;
            case TOKEN_LESS_EQUAL:
                ret.lVal = strlen(left.sVal) <= strlen(right.sVal);
                break;
            case TOKEN_EQUAL_EQUAL:
                ret.lVal = strcmp(left.sVal, right.sVal) == 0?1:0;
                break;
            case TOKEN_BANG_EQUAL:
                ret.lVal = strcmp(left.sVal, right.sVal) == 0?0:1;
                break;
            default:
                printf(runtime_error("Bad logical operator between string operands!"), expr.line);
                stop();
                break;
        }
        return fromLiteral(ret);
    }
    else if((!isNumeric(left) && left.type != LIT_LOGICAL) 
            || (!isNumeric(right) && right.type != LIT_LOGICAL)){
        printf(runtime_error("Bad operand for logical operator!"), expr.line);
        stop();
        return nullObject;
    }
    Literal ret;
    ret.type = LIT_LOGICAL;
    ret.line = left.line;
    double a = left.type == LIT_INT?left.iVal:left.dVal;
    double b = right.type == LIT_INT?right.iVal:right.dVal;
    switch(expr.op.type){
        case TOKEN_GREATER:
            ret.lVal = a > b;
            break;
        case TOKEN_GREATER_EQUAL:
            ret.lVal = a >= b;
            break;
        case TOKEN_LESS:
            ret.lVal = a < b;
            break;
        case TOKEN_LESS_EQUAL:
            ret.lVal = a <= b;
            break;
        case TOKEN_EQUAL_EQUAL:
            ret.lVal = fabs(a - b) <= EPSILON;
            break;
        case TOKEN_BANG_EQUAL:
            ret.lVal = fabs(a - b) > EPSILON;
            break;
        case TOKEN_AND:
            if(left.type != LIT_LOGICAL || right.type != LIT_LOGICAL){
                printf(runtime_error("'And' can only be applied over logical expressions!"), expr.line);
                stop();
            }
            ret.lVal = left.lVal & right.lVal;
            break;
        case TOKEN_OR:
            if(left.type != LIT_LOGICAL || right.type != LIT_LOGICAL){
                printf(runtime_error("'Or' can only be applied over logical expressions!"), expr.line);
                stop();
            }
            ret.lVal = left.lVal | right.lVal;
            break;
        default:
            break;
    }
    return fromLiteral(ret);
}